

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_converter.hpp
# Opt level: O0

type * __thiscall
jsoncons::
value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
::convert<char>(value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_void>
                *this,basic_string_view<char,_std::char_traits<char>_> *value,semantic_tag tag,
               error_code *ec)

{
  const_iterator first;
  char in_CL;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  type *in_RDI;
  type tVar1;
  type res;
  basic_byte_string<std::allocator<unsigned_char>_> *bytes;
  allocator<unsigned_char> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  conv_errc __e;
  error_code *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  
  value_converter_base<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>::get_allocator
            ((value_converter_base<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffff28);
  basic_byte_string<std::allocator<unsigned_char>_>::basic_byte_string
            ((basic_byte_string<std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x323bbd);
  if (in_CL == '\b') {
    std::basic_string_view<char,_std::char_traits<char>_>::begin(in_RDX);
    __e = (conv_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::end(in_RDX);
    tVar1 = decode_base16<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
                      (in_stack_ffffffffffffff50,
                       (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (basic_byte_string<std::allocator<unsigned_char>_> *)
                       in_stack_ffffffffffffff40);
    if (tVar1.ec != success) {
      std::error_code::operator=(in_stack_ffffffffffffff40,__e);
    }
  }
  else if (in_CL == '\t') {
    first = std::basic_string_view<char,_std::char_traits<char>_>::begin(in_RDX);
    std::basic_string_view<char,_std::char_traits<char>_>::end(in_RDX);
    decode_base64<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
              (first,in_stack_ffffffffffffff38,
               (basic_byte_string<std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else if (in_CL == '\f') {
    std::basic_string_view<char,_std::char_traits<char>_>::begin(in_RDX);
    std::basic_string_view<char,_std::char_traits<char>_>::end(in_RDX);
    decode_base64url<char_const*,jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
              ((char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (basic_byte_string<std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffff40,(conv_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  }
  return in_RDI;
}

Assistant:

typename std::enable_if<ext_traits::is_narrow_character<CharT>::value,Into>::type
        convert(const From& value, semantic_tag tag, std::error_code& ec)
        {
            Into bytes(this->get_allocator());
            switch (tag)
            {
                case semantic_tag::base16:
                {
                    auto res = decode_base16(value.begin(), value.end(), bytes);
                    if (res.ec != conv_errc::success)
                    {
                        ec = conv_errc::not_byte_string;
                    }
                    break;
                }
                case semantic_tag::base64:
                {
                    decode_base64(value.begin(), value.end(), bytes);
                    break;
                }
                case semantic_tag::base64url:
                {
                    decode_base64url(value.begin(), value.end(), bytes);
                    break;
                }
                default:
                {
                    ec = conv_errc::not_byte_string;
                    break;
                }
            }
            return bytes;
        }